

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int32_t initializePkgDataFlags(UPKGOptions *o)

{
  FILE *__stream;
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_38;
  int local_34;
  int32_t i_2;
  int32_t i_1;
  int32_t n;
  int32_t i;
  int32_t tmpResult;
  int32_t currentBufferSize;
  int32_t result;
  UErrorCode status;
  UPKGOptions *o_local;
  
  currentBufferSize = 0;
  i = 0x200;
  _result = o;
  pkgDataFlags = (char **)uprv_malloc_63(0x88);
  do {
    if (pkgDataFlags == (char **)0x0) {
      fprintf(_stderr,"Error allocating memory for pkgDataFlags.\n");
      return -1;
    }
    for (i_1 = 0; i_1 < 0x11; i_1 = i_1 + 1) {
      pcVar3 = (char *)uprv_malloc_63((long)i);
      pkgDataFlags[i_1] = pcVar3;
      if (pkgDataFlags[i_1] == (char *)0x0) {
        fprintf(_stderr,"Error allocating memory for pkgDataFlags.\n");
        while (i_2 = i_1 + 1, i_2 < 0x11) {
          pkgDataFlags[i_2] = (char *)0x0;
          i_1 = i_2;
        }
        return -1;
      }
      *pkgDataFlags[i_1] = '\0';
    }
    if (_result->options == (char *)0x0) {
      return 0;
    }
    if (_result->verbose != '\0') {
      fprintf(_stdout,"# Reading options file %s\n",_result->options);
    }
    currentBufferSize = 0;
    iVar2 = parseFlagsFile(_result->options,pkgDataFlags,i,FLAG_NAMES,0x11,&currentBufferSize);
    if (currentBufferSize == 0xf) {
      for (local_34 = 0; i = iVar2, local_34 < 0x11; local_34 = local_34 + 1) {
        if (pkgDataFlags[local_34] != (char *)0x0) {
          uprv_free_63(pkgDataFlags[local_34]);
          pkgDataFlags[local_34] = (char *)0x0;
        }
      }
    }
    else {
      UVar1 = U_FAILURE(currentBufferSize);
      __stream = _stderr;
      if (UVar1 != '\0') {
        pcVar3 = _result->options;
        pcVar4 = u_errorName_63(currentBufferSize);
        fprintf(__stream,"Unable to open or read \"%s\" option file. status = %s\n",pcVar3,pcVar4);
        return -1;
      }
    }
    if (_result->verbose != '\0') {
      fprintf(_stdout,"# pkgDataFlags=\n");
      for (local_38 = 0; (int)local_38 < 0x11; local_38 = local_38 + 1) {
        fprintf(_stdout,"  [%d] %s:  %s\n",(ulong)local_38,FLAG_NAMES[(int)local_38],
                pkgDataFlags[(int)local_38]);
      }
      fprintf(_stdout,"\n");
    }
  } while (currentBufferSize == 0xf);
  return 0;
}

Assistant:

static int32_t initializePkgDataFlags(UPKGOptions *o) {
    UErrorCode status = U_ZERO_ERROR;
    int32_t result = 0;
    int32_t currentBufferSize = SMALL_BUFFER_MAX_SIZE;
    int32_t tmpResult = 0;

    /* Initialize pkgdataFlags */
    pkgDataFlags = (char**)uprv_malloc(sizeof(char*) * PKGDATA_FLAGS_SIZE);

    /* If we run out of space, allocate more */
#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
    do {
#endif
        if (pkgDataFlags != NULL) {
            for (int32_t i = 0; i < PKGDATA_FLAGS_SIZE; i++) {
                pkgDataFlags[i] = (char*)uprv_malloc(sizeof(char) * currentBufferSize);
                if (pkgDataFlags[i] != NULL) {
                    pkgDataFlags[i][0] = 0;
                } else {
                    fprintf(stderr,"Error allocating memory for pkgDataFlags.\n");
                    /* If an error occurs, ensure that the rest of the array is NULL */
                    for (int32_t n = i + 1; n < PKGDATA_FLAGS_SIZE; n++) {
                        pkgDataFlags[n] = NULL;
                    }
                    return -1;
                }
            }
        } else {
            fprintf(stderr,"Error allocating memory for pkgDataFlags.\n");
            return -1;
        }

        if (o->options == NULL) {
            return result;
        }

#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
        /* Read in options file. */
        if(o->verbose) {
          fprintf(stdout, "# Reading options file %s\n", o->options);
        }
        status = U_ZERO_ERROR;
        tmpResult = parseFlagsFile(o->options, pkgDataFlags, currentBufferSize, FLAG_NAMES, (int32_t)PKGDATA_FLAGS_SIZE, &status);
        if (status == U_BUFFER_OVERFLOW_ERROR) {
            for (int32_t i = 0; i < PKGDATA_FLAGS_SIZE; i++) {
                if (pkgDataFlags[i]) {
                    uprv_free(pkgDataFlags[i]);
                    pkgDataFlags[i] = NULL;
                }
            }
            currentBufferSize = tmpResult;
        } else if (U_FAILURE(status)) {
            fprintf(stderr,"Unable to open or read \"%s\" option file. status = %s\n", o->options, u_errorName(status));
            return -1;
        }
#endif
        if(o->verbose) {
            fprintf(stdout, "# pkgDataFlags=\n");
            for(int32_t i=0;i<PKGDATA_FLAGS_SIZE;i++) {
                fprintf(stdout, "  [%d] %s:  %s\n", i, FLAG_NAMES[i], pkgDataFlags[i]);
            }
            fprintf(stdout, "\n");
        }
#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
    } while (status == U_BUFFER_OVERFLOW_ERROR);
#endif

    return result;
}